

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cppcms::json::
  traits<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::get(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,value *v)

{
  pointer pcVar1;
  array *paVar2;
  string *psVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar2 = value::array(v);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(__return_storage_ptr__,
           (long)(paVar2->
                 super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(paVar2->
                 super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3);
  if ((paVar2->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (paVar2->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      psVar3 = value::str_abi_cxx11_
                         ((paVar2->
                          super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar5);
      pcVar1 = (psVar3->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + psVar3->_M_string_length);
      std::__cxx11::string::operator=
                ((string *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar5),(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(paVar2->
                                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(paVar2->
                                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> get(value const &v)
		{
			std::vector<T> result;
			json::array const &a=v.array();
			result.resize(a.size());
			for(unsigned i=0;i<a.size();i++) 
				result[i]=a[i].get_value<T>();
			return result;
		}